

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::render(DecodeToggledCase *this)

{
  pointer ppSVar1;
  SRGBTestTexture *pSVar2;
  pointer ppSVar3;
  SRGBTestSampler *pSVar4;
  pointer ppSVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *this_00;
  size_t textureSourceIdx;
  ulong uVar8;
  long lVar9;
  int samplerIdx;
  long lVar7;
  
  iVar6 = (*((this->super_SRGBTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar7 + 0x78))
            (0x8d40,(((this->super_SRGBTestCase).m_framebuffer.
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar7 + 0xd8))((this->super_SRGBTestCase).m_vaoID);
  uVar8 = 0;
  do {
    ppSVar1 = (this->super_SRGBTestCase).m_shaderProgramList.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_SRGBTestCase).m_shaderProgramList.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar8) {
      uVar8 = 0;
      while( true ) {
        ppSVar5 = (this->super_SRGBTestCase).m_textureSourceList.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_SRGBTestCase).m_textureSourceList.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3) <= uVar8)
        break;
        (**(code **)(lVar7 + 0xb8))(-(uint)(ppSVar5[uVar8]->m_targetType != TEXTURETYPE_2D) | 0xde1)
        ;
        uVar8 = uVar8 + 1;
      }
      (**(code **)(lVar7 + 0x78))(0x8d40,0);
      (**(code **)(lVar7 + 0xd8))(0);
      (**(code **)(lVar7 + 0x40))(0x8892,0);
      return;
    }
    (**(code **)(lVar7 + 0x1680))
              (*(undefined4 *)
                ((long)(ppSVar1[uVar8]->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr + 0x98));
    SRGBTestCase::toggleDecode
              (&this->super_SRGBTestCase,
               &(this->super_SRGBTestCase).m_shaderProgramList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8]->m_uniformDataList);
    for (lVar9 = 0;
        lVar9 < (int)((ulong)((long)(this->super_SRGBTestCase).m_textureSourceList.
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_SRGBTestCase).m_textureSourceList.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar9 = lVar9 + 1) {
      (**(code **)(lVar7 + 8))((int)lVar9 + 0x84c0);
      pSVar2 = (this->super_SRGBTestCase).m_textureSourceList.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      (**(code **)(lVar7 + 0xb8))
                (-(uint)(pSVar2->m_targetType != TEXTURETYPE_2D) | 0xde1,
                 (pSVar2->m_source).m_glTexture);
      iVar6 = (**(code **)(lVar7 + 0xb48))
                        (*(undefined4 *)
                          ((long)((this->super_SRGBTestCase).m_shaderProgramList.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8]->m_program).
                                 super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                 .m_data.ptr + 0x98));
      if (iVar6 == -1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"samplerUniformLocationID != (glw::GLuint) - 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                   ,0x6d2);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar7 + 0x14f0))(iVar6);
    }
    lVar9 = 0;
    while( true ) {
      ppSVar3 = (this->super_SRGBTestCase).m_samplerList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->super_SRGBTestCase).m_samplerList.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3) >> 3) <=
          lVar9) break;
      pSVar4 = ppSVar3[lVar9];
      if (pSVar4->m_isActive == true) {
        (*pSVar4->m_gl->bindSampler)(pSVar4->m_textureUnit,pSVar4->m_samplerHandle);
      }
      lVar9 = lVar9 + 1;
    }
    if ((this->super_SRGBTestCase).m_shaderProgramList.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8]->m_blendRequired == false) {
      (**(code **)(lVar7 + 0x4e8))(0xbe2);
    }
    else {
      (**(code **)(lVar7 + 0x5e0))(0xbe2);
      (**(code **)(lVar7 + 0x100))(0x8008);
      (**(code **)(lVar7 + 0x120))(1,1);
    }
    (**(code **)(lVar7 + 0x538))(4,0,6);
    SRGBTestCase::toggleDecode
              (&this->super_SRGBTestCase,
               &(this->super_SRGBTestCase).m_shaderProgramList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8]->m_uniformDataList);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void DecodeToggledCase::render (void)
{
	// override the base SRGBTestCase render function with the purpose of switching between shader programs,
	// toggling texture sRGB decode state between draw calls
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);
	gl.bindVertexArray(m_vaoID);

	for (std::size_t programIdx = 0; programIdx < m_shaderProgramList.size(); programIdx++)
	{
		gl.useProgram(m_shaderProgramList[programIdx]->getHandle());

		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());

		for (int textureSourceIdx = 0; textureSourceIdx < (int)m_textureSourceList.size(); textureSourceIdx++)
		{
			gl.activeTexture(GL_TEXTURE0 + (glw::GLenum)textureSourceIdx);
			gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), m_textureSourceList[textureSourceIdx]->getHandle());
			glw::GLuint samplerUniformLocationID = gl.getUniformLocation(m_shaderProgramList[programIdx]->getHandle(), m_shaderProgramList[programIdx]->getUniformAtLocation(textureSourceIdx).name.c_str());
			TCU_CHECK(samplerUniformLocationID != (glw::GLuint) - 1);
			gl.uniform1i(samplerUniformLocationID, (glw::GLenum)textureSourceIdx);
		}

		for (int samplerIdx = 0; samplerIdx < (int)m_samplerList.size(); samplerIdx++)
		{
			if (m_samplerList[samplerIdx]->getIsActive() == true)
			{
				m_samplerList[samplerIdx]->bindToTexture();
			}
		}

		if (m_shaderProgramList[programIdx]->getBlendRequired() == true)
		{
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MAX);
			gl.blendFunc(GL_ONE, GL_ONE);
		}
		else
		{
			gl.disable(GL_BLEND);
		}

		gl.drawArrays(GL_TRIANGLES, 0, 6);

		// reset sRGB decode state on textures
		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());
	}

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), 0);
	}
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}